

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O0

void __thiscall
siamese::RecoveryMatrixState::ResumeGE(RecoveryMatrixState *this,uint oldRows,uint rows)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint newRowIndex;
  uint8_t *rem_row;
  uint pivotColumnCount;
  uint8_t val_i;
  uint8_t *ge_row;
  uint matrixRowIndex_i;
  uint pivot_i;
  uint stride;
  uint8_t y;
  uint8_t val_j;
  int in_stack_00000314;
  void *in_stack_00000318;
  uint8_t in_stack_00000327;
  void *in_stack_00000328;
  uint local_cc;
  long local_c8;
  uint local_a8;
  
  if (in_ESI < in_EDX) {
    uVar2 = *(uint *)(in_RDI + 900);
    for (local_a8 = 0; local_a8 < *(uint *)(in_RDI + 0x400); local_a8 = local_a8 + 1) {
      iVar3 = *(int *)(*(long *)(in_RDI + 0x3f0) + (long)(int)local_a8 * 4);
      bVar1 = *(byte *)(*(long *)(in_RDI + 0x370) + (ulong)(uVar2 * iVar3) + (ulong)local_a8);
      uVar4 = *(uint *)(*(long *)(in_RDI + 0x1b0) + (long)iVar3 * 0x10 + 0xc);
      local_c8 = *(long *)(in_RDI + 0x370) + (ulong)(uVar2 * in_ESI);
      for (local_cc = in_ESI; local_cc < in_EDX; local_cc = local_cc + 1) {
        if (*(byte *)(local_c8 + (ulong)local_a8) != 0) {
          *(uint8_t *)(local_c8 + (ulong)local_a8) =
               GF256Ctx.GF256_DIV_TABLE
               [(uint)bVar1 * 0x100 + (uint)*(byte *)(local_c8 + (ulong)local_a8)];
          gf256_muladd_mem(in_stack_00000328,in_stack_00000327,in_stack_00000318,in_stack_00000314);
          if (*(uint *)(*(long *)(in_RDI + 0x1b0) + (long)(int)local_cc * 0x10 + 0xc) < uVar4) {
            *(uint *)(*(long *)(in_RDI + 0x1b0) + (long)(int)local_cc * 0x10 + 0xc) = uVar4;
          }
        }
        local_c8 = local_c8 + (ulong)uVar2;
      }
    }
  }
  return;
}

Assistant:

void RecoveryMatrixState::ResumeGE(const unsigned oldRows, const unsigned rows)
{
    // If we did not add any new rows:
    if (oldRows >= rows)
    {
        SIAMESE_DEBUG_ASSERT(oldRows == rows);
        return;
    }

    const unsigned stride = Matrix.AllocatedColumns;

    // For each pivot we have determined already:
    for (unsigned pivot_i = 0; pivot_i < GEResumePivot; ++pivot_i)
    {
        // Get the row for that pivot
        const unsigned matrixRowIndex_i = Pivots.GetRef(pivot_i);
        const uint8_t* ge_row = Matrix.Data + stride * matrixRowIndex_i;
        const uint8_t val_i   = ge_row[pivot_i];
        SIAMESE_DEBUG_ASSERT(val_i != 0);

        const unsigned pivotColumnCount = Rows.GetRef(matrixRowIndex_i).MatrixColumnCount;

        uint8_t* rem_row = Matrix.Data + stride * oldRows;

        // For each new row that was added:
        for (unsigned newRowIndex = oldRows; newRowIndex < rows; ++newRowIndex, rem_row += stride)
        {
            if (EliminateRow(ge_row, rem_row, pivot_i, pivotColumnCount, val_i))
            {
                // Grow the column count of this row if we just filled it in on the right
                if (Rows.GetRef(newRowIndex).MatrixColumnCount < pivotColumnCount)
                    Rows.GetRef(newRowIndex).MatrixColumnCount = pivotColumnCount;
            }
            SIAMESE_DEBUG_ASSERT(Pivots.GetRef(newRowIndex) == newRowIndex);
        }
    }
}